

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi_field_small.h
# Opt level: O2

bool Gudhi::persistence_fields::
     Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void>::_is_prime(uint p)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  if (p < 2) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if (3 < p) {
      bVar2 = false;
      if (((p & 1) != 0) && (p % 3 != 0)) {
        uVar4 = (ulong)p;
        uVar5 = 7;
        do {
          uVar3 = uVar5 - 2;
          uVar1 = uVar3 * uVar3;
          bVar6 = uVar1 - uVar4 != 0;
          bVar2 = uVar4 <= uVar1 && bVar6;
          if (uVar4 <= uVar1 && bVar6) {
            return bVar2;
          }
          if (uVar4 % uVar3 == 0) {
            return bVar2;
          }
          uVar3 = uVar4 % uVar5;
          uVar5 = uVar5 + 6;
        } while (uVar3 != 0);
      }
    }
  }
  return bVar2;
}

Assistant:

static constexpr bool _is_prime(const unsigned int p) {
    if (p <= 1) return false;
    if (p <= 3) return true;
    if (p % 2 == 0 || p % 3 == 0) return false;

    for (unsigned long i = 5; i * i <= p; i = i + 6)
      if (p % i == 0 || p % (i + 2) == 0) return false;

    return true;
  }